

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O1

void spell_message(monster_conflict *mon,monster_spell *spell,_Bool seen,_Bool hits)

{
  ushort uVar1;
  monster_spell_level *pmVar2;
  monster_race *pmVar3;
  char cVar4;
  int iVar5;
  monster_spell_level *pmVar6;
  byte *pbVar7;
  ushort **ppuVar8;
  char *pcVar9;
  wchar_t mode;
  monster_altmsg *pmVar10;
  monster_conflict *pmVar11;
  wchar_t wVar12;
  ulong uVar13;
  char *fmt;
  byte *__s;
  byte bVar14;
  size_t end;
  char punct [8];
  char m_name [80];
  char buf [1024];
  size_t local_4a8;
  char local_4a0 [8];
  monster_conflict *local_498;
  monster_spell *local_490;
  char local_488 [80];
  char local_438 [1032];
  
  builtin_strncpy(local_4a0,".!?;:,\'",8);
  memset(local_438,0,0x400);
  local_4a8 = 0;
  pmVar2 = spell->level;
  do {
    pmVar6 = pmVar2;
    pmVar2 = pmVar6->next;
    if (pmVar2 == (monster_spell_level *)0x0) break;
  } while (pmVar2->power <= mon->race->spell_power);
  wVar12 = (mon->target).midx;
  if (wVar12 < L'\x01') {
    local_498 = (monster_conflict *)0x0;
  }
  else {
    local_498 = (monster_conflict *)cave_monster(cave,wVar12);
  }
  if (seen) {
    pmVar3 = mon->race;
    uVar1 = spell->index;
    uVar13 = (ulong)uVar1;
    pmVar10 = pmVar3->spell_msgs;
    __s = (byte *)0x0;
    if (hits) {
      for (; pmVar10 != (monster_altmsg *)0x0; pmVar10 = pmVar10->next) {
        if ((pmVar10->index == uVar1) && (pmVar10->msg_type == MON_ALTMSG_SEEN)) {
          __s = (byte *)pmVar10->message;
          break;
        }
      }
      if (__s == (byte *)0x0) {
        __s = (byte *)pmVar6->message;
        if (__s == (byte *)0x0) {
          pcVar9 = pmVar3->name;
          fmt = "No message-vis for monster spell %d cast by %s.  Please report this bug.";
LAB_00183eea:
          msg(fmt,uVar13,pcVar9);
          return;
        }
        goto LAB_00183bae;
      }
    }
    else {
      for (; pmVar10 != (monster_altmsg *)0x0; pmVar10 = pmVar10->next) {
        if ((pmVar10->index == uVar1) && (pmVar10->msg_type == MON_ALTMSG_MISS)) {
          __s = (byte *)pmVar10->message;
          break;
        }
      }
      if (__s == (byte *)0x0) {
        __s = (byte *)pmVar6->miss_message;
        if (__s == (byte *)0x0) {
          pcVar9 = pmVar3->name;
          fmt = "No message-miss for monster spell %d cast by %s.  Please report this bug.";
          goto LAB_00183eea;
        }
        goto LAB_00183bae;
      }
    }
  }
  else {
    if (local_498 != (monster_conflict *)0x0) {
      return;
    }
    uVar13 = (ulong)spell->index;
    __s = (byte *)0x0;
    for (pmVar10 = mon->race->spell_msgs; pmVar10 != (monster_altmsg *)0x0; pmVar10 = pmVar10->next)
    {
      if ((pmVar10->index == spell->index) && (pmVar10->msg_type == MON_ALTMSG_UNSEEN)) {
        __s = (byte *)pmVar10->message;
        break;
      }
    }
    if (__s == (byte *)0x0) {
      __s = (byte *)pmVar6->blind_message;
      if (__s == (byte *)0x0) {
        pcVar9 = mon->race->name;
        fmt = "No message-invis for monster spell %d cast by %s.  Please report this bug.";
        goto LAB_00183eea;
      }
      goto LAB_00183bae;
    }
  }
  if (*__s == 0) {
    return;
  }
LAB_00183bae:
  local_490 = spell;
  pbVar7 = (byte *)strchr((char *)__s,0x7b);
  if (pbVar7 != (byte *)0x0) {
    wVar12 = (uint)(pbVar7 == __s) << 8 | 0x14;
    do {
      strnfcat(local_438,0x400,&local_4a8,"%.*s",(ulong)(uint)((int)pbVar7 - (int)__s),__s);
      __s = pbVar7 + 1;
      bVar14 = pbVar7[1];
      if (bVar14 != 0) {
        ppuVar8 = __ctype_b_loc();
        pbVar7 = pbVar7 + 2;
LAB_00183c24:
        if ((*(byte *)((long)*ppuVar8 + (ulong)bVar14 * 2 + 1) & 4) != 0) goto code_r0x00183c2f;
        if (bVar14 != 0x7d) goto switchD_00183d23_default;
        iVar5 = strncmp((char *)__s,"name",4);
        if (iVar5 == 0) {
          cVar4 = '\x01';
        }
        else {
          iVar5 = strncmp((char *)__s,"pronoun",7);
          if (iVar5 == 0) {
            cVar4 = '\x02';
          }
          else {
            iVar5 = strncmp((char *)__s,"target",6);
            if (iVar5 == 0) {
              cVar4 = '\x03';
            }
            else {
              iVar5 = strncmp((char *)__s,"type",4);
              if (iVar5 == 0) {
                cVar4 = '\x04';
              }
              else {
                iVar5 = strncmp((char *)__s,"oftype",6);
                cVar4 = (iVar5 == 0) * '\x05';
              }
            }
          }
        }
        __s = pbVar7;
        pmVar11 = mon;
        switch(cVar4) {
        case '\x01':
          pcVar9 = strchr(local_4a0,(int)(char)*pbVar7);
          mode = wVar12 | 0x200;
          if (pcVar9 != (char *)0x0) {
            mode = wVar12;
          }
          break;
        case '\x02':
          mode = L'\"';
          break;
        case '\x03':
          if ((mon->target).midx < L'\x01') {
            strnfcat(local_438,0x400,&local_4a8,"you");
            goto switchD_00183d23_default;
          }
          pcVar9 = strchr(local_4a0,(int)(char)*pbVar7);
          pmVar11 = local_498;
          mode = (uint)(pcVar9 == (char *)0x0) << 9 | 0x15;
          break;
        case '\x04':
          pcVar9 = projections[mon->race->blow->effect->lash_type].lash_desc;
          goto LAB_00183e5b;
        case '\x05':
          pcVar9 = projections[mon->race->blow->effect->lash_type].lash_desc;
          if (pcVar9 != (char *)0x0) {
            strnfcat(local_438,0x400,&local_4a8," of ");
            goto LAB_00183e5b;
          }
        default:
          goto switchD_00183d23_default;
        }
        pcVar9 = local_488;
        monster_desc(pcVar9,0x50,(monster *)pmVar11,mode);
LAB_00183e5b:
        strnfcat(local_438,0x400,&local_4a8,"%s",pcVar9);
      }
switchD_00183d23_default:
      pbVar7 = (byte *)strchr((char *)__s,0x7b);
      wVar12 = L'\x14';
    } while (pbVar7 != (byte *)0x0);
  }
  strnfcat(local_438,0x400,&local_4a8,"%s",__s);
  msgt(local_490->msgt,"%s",local_438);
  return;
code_r0x00183c2f:
  bVar14 = *pbVar7;
  pbVar7 = pbVar7 + 1;
  if (bVar14 == 0) goto switchD_00183d23_default;
  goto LAB_00183c24;
}

Assistant:

static void spell_message(struct monster *mon,
						  const struct monster_spell *spell,
						  bool seen, bool hits)
{
	const char punct[] = ".!?;:,'";
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;
	struct monster_spell_level *level = spell->level;
	struct monster *t_mon = NULL;
	bool is_leading;

	/* Get the right level of message */
	while (level->next && mon->race->spell_power >= level->next->power) {
		level = level->next;
	}

	/* Get the target monster, if any */
	if (mon->target.midx > 0) {
		t_mon = cave_monster(cave, mon->target.midx);
	}

	/* Get the message */
	if (!seen) {
		if (t_mon) {
			return;
		} else {
			in_cursor = find_alternate_spell_message(mon->race,
				spell->index, MON_ALTMSG_UNSEEN);
			if (in_cursor == NULL) {
				in_cursor = level->blind_message;
				if (in_cursor == NULL) {
					msg("No message-invis for monster "
						"spell %d cast by %s.  "
						"Please report this bug.",
						(int)spell->index,
						mon->race->name);
					return;
				}
			} else if (in_cursor[0] == '\0') {
				return;
			}
		}
	} else if (!hits) {
		in_cursor = find_alternate_spell_message(mon->race,
			spell->index, MON_ALTMSG_MISS);
		if (in_cursor == NULL) {
			in_cursor = level->miss_message;
			if (in_cursor == NULL) {
				msg("No message-miss for monster spell %d "
					"cast by %s.  Please report this bug.",
					(int)spell->index, mon->race->name);
				return;
			}
		} else if (in_cursor[0] == '\0') {
			return;
		}
	} else {
		in_cursor = find_alternate_spell_message(mon->race,
			spell->index, MON_ALTMSG_SEEN);
		if (in_cursor == NULL) {
			in_cursor = level->message;
			if (in_cursor == NULL) {
				msg("No message-vis for monster spell %d "
					"cast by %s.  Please report this bug.",
					(int)spell->index, mon->race->name);
				return;
			}
		} else if (in_cursor[0] == '\0') {
			return;
		}
	}

	next = strchr(in_cursor, '{');
	is_leading = (next == in_cursor);
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;

			switch (spell_tag_lookup(tag)) {
				case SPELL_TAG_NAME: {
					char m_name[80];
					int mdesc_mode = (MDESC_IND_HID |
						MDESC_PRO_HID);

					if (is_leading) {
						mdesc_mode |= MDESC_CAPITAL;
					}
					if (!strchr(punct, *in_cursor)) {
						mdesc_mode |= MDESC_COMMA;
					}
					monster_desc(m_name, sizeof(m_name),
						mon, mdesc_mode);

					strnfcat(buf, sizeof(buf), &end, "%s",
						m_name);
					break;
				}

				case SPELL_TAG_PRONOUN: {
					char m_poss[80];

					/* Get the monster possessive ("his"/"her"/"its") */
					monster_desc(m_poss, sizeof(m_poss), mon, MDESC_PRO_VIS | MDESC_POSS);

					strnfcat(buf, sizeof(buf), &end, "%s",
						m_poss);
					break;
				}

				case SPELL_TAG_TARGET: {
					char m_name[80];
					if (mon->target.midx > 0) {
						int mdesc_mode = MDESC_TARG;

						if (!strchr(punct, *in_cursor)) {
							mdesc_mode |= MDESC_COMMA;
						}
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							mdesc_mode);
						strnfcat(buf, sizeof(buf), &end,
							"%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "you");
					}
					break;
				}

				case SPELL_TAG_TYPE: {
					/* Get the attack type (assuming lash) */
					int type = mon->race->blow[0].effect->lash_type;
					char *type_name = projections[type].lash_desc;

					strnfcat(buf, sizeof(buf), &end, "%s",
						type_name);
					break;
				}

				case SPELL_TAG_OF_TYPE: {
					/* Get the attack type (assuming lash) */
					int type = mon->race->blow[0].effect->lash_type;
					char *type_name = projections[type].lash_desc;

					if (type_name) {
						strnfcat(buf, sizeof(buf), &end, " of ");
						strnfcat(buf, sizeof(buf), &end,
							"%s", type_name);
					}
					break;
				}

				default: {
					break;
				}
			}
		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
		is_leading = false;
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);

	msgt(spell->msgt, "%s", buf);
}